

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

double __thiscall
ParserProbModelXML::QueryTable
          (ParserProbModelXML *this,xmlNodePtr node,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          *t0_deps,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *t1_deps)

{
  bool bVar1;
  Index IVar2;
  xmlNodePtr pxVar3;
  ParserProbModelXML *this_00;
  size_type sVar4;
  const_reference pvVar5;
  xmlNodePtr pxVar6;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  ostream *poVar10;
  stringstream ss;
  Index jIdx;
  string name;
  int timeslice;
  Index i;
  const_iterator it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> factor_sizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> factor_values;
  xmlNodePtr current;
  vector<double,_std::allocator<double>_> *data;
  xmlNodePtr data_node;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  string *in_stack_fffffffffffffbb0;
  xmlNodePtr in_stack_fffffffffffffbb8;
  ParserProbModelXML *in_stack_fffffffffffffbc0;
  allocator<char> *in_stack_fffffffffffffbd0;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  const_iterator in_stack_fffffffffffffbe0;
  const_iterator in_stack_fffffffffffffbe8;
  xmlNodePtr in_stack_fffffffffffffc10;
  ParserProbModelXML *in_stack_fffffffffffffc18;
  string local_388 [32];
  stringstream local_368 [16];
  ostream local_358 [224];
  xmlNodePtr in_stack_fffffffffffffd88;
  ParserProbModelXML *in_stack_fffffffffffffd90;
  _Self local_188;
  _Self local_180;
  _Base_ptr local_178;
  _Base_ptr local_170;
  string local_168 [32];
  int local_148;
  int local_144;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
  local_140 [7];
  undefined1 local_101 [33];
  long local_e0;
  vector<double,_std::allocator<double>_> *local_d8;
  undefined1 local_c9;
  allocator<char> local_51;
  string local_50 [32];
  xmlNodePtr local_30;
  value_type local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbe0._M_node,
             (char *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
             in_stack_fffffffffffffbd0);
  pxVar3 = FindChild(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  local_30 = pxVar3;
  if (pxVar3 == (xmlNodePtr)0x0) {
    local_c9 = 1;
    this_00 = (ParserProbModelXML *)__cxa_allocate_exception(0x28);
    GetVariableName_abi_cxx11_(this_00,in_stack_fffffffffffffc10);
    std::operator+((char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
    EParse::EParse((EParse *)in_stack_fffffffffffffbe0._M_node,
                   (string *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
    local_c9 = 0;
    __cxa_throw(this_00,&EParse::typeinfo,EParse::~EParse);
  }
  local_d8 = ParseArray(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  sVar4 = std::vector<double,_std::allocator<double>_>::size(local_d8);
  if (sVar4 == 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                        (size_type)in_stack_fffffffffffffb98);
    local_8 = *pvVar5;
  }
  else {
    pxVar3 = (xmlNodePtr)local_101;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbe0._M_node,
               (char *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               in_stack_fffffffffffffbd0);
    pxVar6 = FindChild(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0
                      );
    lVar7 = xmlLastElementChild(pxVar6);
    std::__cxx11::string::~string((string *)(local_101 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_101);
    local_e0 = lVar7;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa86475);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa86482);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
    ::_Rb_tree_const_iterator(local_140);
    local_144 = 0;
    for (; local_e0 != 0; local_e0 = *(long *)(local_e0 + 0x38)) {
      if (*(int *)(local_e0 + 8) == 1) {
        local_148 = GetVariableTimeslice
                              ((ParserProbModelXML *)in_stack_fffffffffffffbe8._M_node,
                               (xmlNodePtr)in_stack_fffffffffffffbe0._M_node);
        GetVariableName_abi_cxx11_(in_stack_fffffffffffffc18,pxVar3);
        if (local_148 == 0) {
          in_stack_fffffffffffffbe8 =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::find(in_stack_fffffffffffffb98,(key_type *)0xa86523);
          local_170 = in_stack_fffffffffffffbe8._M_node;
          local_140[0]._M_node = in_stack_fffffffffffffbe8._M_node;
        }
        else {
          in_stack_fffffffffffffbe0 =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::find(in_stack_fffffffffffffb98,(key_type *)0xa865dc);
          local_178 = in_stack_fffffffffffffbe0._M_node;
          local_140[0]._M_node = in_stack_fffffffffffffbe0._M_node;
        }
        local_180._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
             ::end(in_stack_fffffffffffffb98);
        bVar1 = std::operator==(local_140,&local_180);
        in_stack_fffffffffffffbdf = true;
        if (!bVar1) {
          local_188._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::end(in_stack_fffffffffffffb98);
          in_stack_fffffffffffffbdf = std::operator==(local_140,&local_188);
        }
        if ((bool)in_stack_fffffffffffffbdf != false) {
          uVar8 = __cxa_allocate_exception(0x28);
          std::operator+((char *)in_stack_fffffffffffffbe8._M_node,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffbe0._M_node);
          std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
          EParse::EParse((EParse *)in_stack_fffffffffffffbe0._M_node,
                         (string *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
          __cxa_throw(uVar8,&EParse::typeinfo,EParse::~EParse);
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
                      *)0xa8677d);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffbb0,
                   (value_type_conflict1 *)in_stack_fffffffffffffba8);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
                      *)0xa867a0);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffba0,(value_type_conflict2 *)in_stack_fffffffffffffb98);
        local_144 = local_144 + 1;
        std::__cxx11::string::~string(local_168);
      }
    }
    IVar2 = IndexTools::IndividualToJointIndices
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffbb8,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffbb0);
    uVar9 = (ulong)IVar2;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(local_d8);
    if (sVar4 <= uVar9) {
      std::__cxx11::stringstream::stringstream(local_368);
      poVar10 = std::operator<<(local_358,"CPD indexed value for variable ");
      GetVariableName_abi_cxx11_(in_stack_fffffffffffffc18,pxVar3);
      poVar10 = std::operator<<(poVar10,local_388);
      std::operator<<(poVar10," out of bounds");
      std::__cxx11::string::~string(local_388);
      uVar8 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      EParse::EParse((EParse *)in_stack_fffffffffffffbe0._M_node,
                     (string *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
      __cxa_throw(uVar8,&EParse::typeinfo,EParse::~EParse);
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                        (size_type)in_stack_fffffffffffffb98);
    local_8 = *pvVar5;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffbb0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffbb0);
  }
  return local_8;
}

Assistant:

double ParserProbModelXML::QueryTable(const xmlNodePtr node,
                                      const std::map<std::string, std::pair<Index, Index> > t0_deps, 
                                      const std::map<std::string, std::pair<Index, Index> > t1_deps)
{
    xmlNodePtr data_node = FindChild(node, "Values");
    if(data_node == NULL)
        throw EParse("Variable " + GetVariableName(node) + " has an empty CPD");
    const vector<double>* data = ParseArray(data_node);

    if(data->size() == 1) //typically the case for rewards in ADDs
        return data->at(0);

    xmlNodePtr current = xmlLastElementChild(FindChild(node, "Variables"));
    vector<Index> factor_values;
    vector<size_t> factor_sizes;
    map<string, pair<Index, Index> >::const_iterator it;
        
    for(Index i = 0; current != NULL;)
    {
        if(current->type == XML_ELEMENT_NODE)
        {
            int timeslice = GetVariableTimeslice(current);
            string name = GetVariableName(current);
            if(timeslice == 0)
            {
                it = t0_deps.find(name);
            }
            else
            {
                it = t1_deps.find(name);
            }
            if(it == t0_deps.end() || it == t1_deps.end())
            {
              throw EParse("Requested variable \"" + name + "\" which is not present in the dependencies of this CPT.");
            }
            factor_values.push_back(it->second.first);
            factor_sizes.push_back(it->second.second);
            i++;
        }
        current = current->prev;
    }

    Index jIdx = IndexTools::IndividualToJointIndices(factor_values, factor_sizes);

    if(jIdx < data->size())
    {
      return data->at(jIdx);
    }
    else
    {
      stringstream ss;
      ss << "CPD indexed value for variable " << GetVariableName(node) << " out of bounds";
      throw EParse(ss.str());
    }
}